

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::logProgram
          (TextureCubeMapArraySamplingTest *this,programDefinition *info)

{
  ostringstream *this_00;
  shaderDefinition *psVar1;
  shaderDefinition *psVar2;
  shaderDefinition *psVar3;
  shaderDefinition *psVar4;
  shaderDefinition *psVar5;
  shaderDefinition *psVar6;
  MessageBuilder message;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  if (info->m_program_object_id != 0) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Program id: ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    psVar1 = info->compute_shader;
    psVar2 = info->geometry_shader;
    psVar3 = info->fragment_shader;
    psVar4 = info->tesselation_control_shader;
    psVar5 = info->tesselation_evaluation_shader;
    psVar6 = info->vertex_shader;
    if (psVar1 != (shaderDefinition *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"\nCompute shader:\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(psVar1->m_source)._M_dataplus._M_p,
                 (psVar1->m_source)._M_string_length);
    }
    if (psVar6 != (shaderDefinition *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"\nVertex shader:\n",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(psVar6->m_source)._M_dataplus._M_p,
                 (psVar6->m_source)._M_string_length);
    }
    if (psVar2 != (shaderDefinition *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"\nGeometry shader:\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(psVar2->m_source)._M_dataplus._M_p,
                 (psVar2->m_source)._M_string_length);
    }
    if (psVar4 != (shaderDefinition *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\nTCS shader:\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(psVar4->m_source)._M_dataplus._M_p,
                 (psVar4->m_source)._M_string_length);
    }
    if (psVar5 != (shaderDefinition *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\nTES shader:\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(psVar5->m_source)._M_dataplus._M_p,
                 (psVar5->m_source)._M_string_length);
    }
    if (psVar3 != (shaderDefinition *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"\nFragment shader:\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(psVar3->m_source)._M_dataplus._M_p,
                 (psVar3->m_source)._M_string_length);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

glw::GLuint TextureCubeMapArraySamplingTest::programDefinition::getProgramId() const
{
	return m_program_object_id;
}